

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  Curl_addrinfo *hostname;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  connectdata *conn;
  char *pcVar9;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_160;
  uint uStack_15c;
  Curl_dns_entry *local_158;
  int local_14c;
  connectdata *local_148;
  Curl_easy *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  
  conn = data->conn;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar9 = (data->state).buffer + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar3 = (conn->proto).ftpc.count1;
  local_14c = ftpcode;
  if (ftpcode == 0xe5 && iVar3 == 0) {
    pcVar5 = strchr(pcVar9,0x28);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = pcVar5 + 1;
      iVar3 = __isoc99_sscanf(pcVar5,"%c%c%c%u%c",&local_160,(long)&local_160 + 1,
                              (long)&local_160 + 2,&local_138,(long)&local_160 + 3);
      bVar2 = true;
      if (iVar3 == 5) {
        lVar6 = 1;
        do {
          if (*(char *)((long)&local_160 + lVar6) != (char)local_160) {
            pcVar5 = (char *)0x0;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        if ((uint)local_138 < 0x10000) {
          if (pcVar5 != (char *)0x0) {
            (conn->proto).ftpc.newport = (unsigned_short)local_138;
            if (((conn->bits).field_0x4 & 10) == 0) {
              pcVar7 = conn->primary_ip;
            }
            else {
              pcVar7 = (conn->host).name;
            }
            pcVar7 = (*Curl_cstrdup)(pcVar7);
            (conn->proto).ftpc.newhost = pcVar7;
            if (pcVar7 == (char *)0x0) {
              pcVar9 = (char *)0x1b;
              bVar2 = false;
            }
          }
        }
        else {
          bVar2 = false;
          Curl_failf(data,"Illegal port number in EPSV reply");
          pcVar9 = (char *)0xd;
        }
      }
      else {
        pcVar5 = (char *)0x0;
      }
      CVar4 = (CURLcode)pcVar9;
      if (!bVar2) goto LAB_00511335;
    }
    CVar4 = (CURLcode)pcVar9;
    bVar2 = true;
    if (pcVar5 == (char *)0x0) {
      bVar2 = false;
      Curl_failf(data,"Weirdly formatted EPSV reply");
      CVar4 = CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (ftpcode != 0xe3 || iVar3 != 1) {
      if (iVar3 == 0) {
        CVar4 = ftp_epsv_disable(data,conn);
        return CVar4;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",ftpcode);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    local_138 = 0;
    uStack_130 = 0;
    _local_160 = 0;
    local_148 = conn;
    local_140 = data;
    if (*pcVar9 != '\0') {
      pcVar5 = pcVar9;
      do {
        iVar3 = __isoc99_sscanf(pcVar5,"%u,%u,%u,%u,%u,%u",&local_138,(long)&local_138 + 4,
                                &uStack_130,(long)&uStack_130 + 4,&local_160,&uStack_15c);
        pcVar9 = pcVar5;
        if (iVar3 == 6) break;
        pcVar9 = pcVar5 + 1;
        pcVar7 = pcVar5 + 1;
        pcVar5 = pcVar9;
      } while (*pcVar7 != '\0');
    }
    data = local_140;
    conn = local_148;
    CVar4 = (CURLcode)pcVar9;
    if (((((*pcVar9 == '\0') || (0xff < (uint)local_138)) || (0xff < local_138._4_4_)) ||
        ((0xff < (uint)uStack_130 || (0xff < uStack_130._4_4_)))) ||
       ((0xff < local_160 || (0xff < uStack_15c)))) {
      bVar2 = false;
      Curl_failf(local_140,"Couldn\'t interpret the 227-response");
      CVar4 = CURLE_FTP_WEIRD_227_FORMAT;
      conn = local_148;
      goto LAB_00511337;
    }
    if (((local_140->set).field_0x8e3 & 0x40) == 0) {
      pcVar9 = curl_maprintf("%u.%u.%u.%u",local_138 & 0xffffffff,(ulong)local_138._4_4_,
                             uStack_130 & 0xffffffff,(ulong)uStack_130._4_4_);
    }
    else {
      Curl_infof(local_140,"Skip %u.%u.%u.%u for data connection, re-use %s instead");
      if (((conn->bits).field_0x4 & 10) == 0) {
        pcVar9 = conn->primary_ip;
      }
      else {
        pcVar9 = (conn->host).name;
      }
      pcVar9 = (*Curl_cstrdup)(pcVar9);
    }
    (conn->proto).ftpc.newhost = pcVar9;
    if (pcVar9 != (char *)0x0) {
      (conn->proto).ftpc.newport = (short)(local_160 << 8) + (short)((ulong)_local_160 >> 0x20);
      bVar2 = true;
      goto LAB_00511337;
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
LAB_00511335:
    bVar2 = false;
  }
LAB_00511337:
  if (!bVar2) {
    return CVar4;
  }
  uVar8 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar8 & 0x20) == 0) {
    if (((uVar8 & 0x2000080) == 0x2000000) && (*(conn->proto).ftpc.newhost == '\0')) {
      Curl_conninfo_remote(data,conn,conn->sock[0]);
      (*Curl_cfree)((conn->proto).ftpc.newhost);
      (conn->proto).ftpc.newhost = (char *)0x0;
      if (((conn->bits).field_0x4 & 10) == 0) {
        pcVar9 = conn->primary_ip;
      }
      else {
        pcVar9 = (conn->host).name;
      }
      pcVar9 = (*Curl_cstrdup)(pcVar9);
      (conn->proto).ftpc.newhost = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_resolv(data,(conn->proto).ftpc.newhost,(uint)(conn->proto).ftpc.newport,false,&local_158);
    uVar8 = (uint)(conn->proto).ftpc.newport;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Can\'t resolve new host %s:%hu",(conn->proto).ftpc.newhost,(ulong)uVar8);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    hostname = conn->tempaddr[(ulong)((uVar8 & 2) == 0) * 8 + 0xe];
    Curl_resolv(data,(char *)hostname,conn->port,false,&local_158);
    uVar8 = conn->port;
    if (local_158 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Can\'t resolve proxy host %s:%hu",hostname,(ulong)(uVar8 & 0xffff));
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  (conn->bits).tcpconnect[1] = false;
  CVar4 = Curl_connecthost(data,conn,local_158);
  if (CVar4 == CURLE_OK) {
    if (((data->set).field_0x8e5 & 8) != 0) {
      pcVar9 = (conn->proto).ftpc.newhost;
      Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
      Curl_infof(data,"Connecting to %s (%s) port %d",pcVar9,&local_138,(ulong)(uVar8 & 0xffff));
    }
    Curl_resolv_unlock(data,local_158);
    (*Curl_cfree)(conn->secondaryhostname);
    conn->secondaryhostname = (char *)0x0;
    conn->secondary_port = (conn->proto).ftpc.newport;
    pcVar9 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
    conn->secondaryhostname = pcVar9;
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 | 0x20;
    (data->conn->proto).ftpc.state = FTP_STOP;
    return CURLE_OK;
  }
  Curl_resolv_unlock(data,local_158);
  if (local_14c != 0xe5) {
    return CVar4;
  }
  if ((conn->proto).ftpc.count1 == 0) {
    CVar4 = ftp_epsv_disable(data,conn);
    return CVar4;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *addr = NULL;
  enum resolve_t rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str = &data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i = 1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr = NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[4] = {0, 0, 0, 0};
    unsigned int port[2] = {0, 0};

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%u,%u,%u,%u,%u,%u",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str || (ip[0] > 255) || (ip[1] > 255)  || (ip[2] > 255)  ||
       (ip[3] > 255) || (port[0] > 255)  || (port[1] > 255) ) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, re-use %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(data, host_name, (int)conn->port, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      Curl_conninfo_remote(data, conn, conn->sock[FIRSTSOCKET]);
      Curl_safefree(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    rc = Curl_resolv(data, ftpc->newhost, ftpc->newport, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(data, conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  state(data, FTP_STOP); /* this phase is completed */

  return result;
}